

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O1

void __thiscall libtorrent::aux::chained_buffer::~chained_buffer(chained_buffer *this)

{
  pointer pcVar1;
  
  clear(this);
  pcVar1 = (this->m_tmp_vec).
           super__Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)(this->m_tmp_vec).
                                 super__Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar1);
  }
  ::std::
  _Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::~_Deque_base((_Deque_base<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
                  *)this);
  return;
}

Assistant:

chained_buffer::~chained_buffer()
	{
		TORRENT_ASSERT(!m_destructed);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_bytes >= 0);
		TORRENT_ASSERT(m_capacity >= 0);
		clear();
#if TORRENT_USE_ASSERTS
		m_destructed = true;
#endif
	}